

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptor::GetSourceLocation
          (FileDescriptor *this,vector<int,_std::allocator<int>_> *path,SourceLocation *out_location
          )

{
  int iVar1;
  int iVar2;
  SourceCodeInfo_Location *this_00;
  RepeatedField<int> *this_01;
  int *piVar3;
  string *psVar4;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar5;
  const_iterator __first;
  const_iterator __last;
  RepeatedField<int> *span;
  SourceCodeInfo_Location *loc;
  SourceLocation *out_location_local;
  vector<int,_std::allocator<int>_> *path_local;
  FileDescriptor *this_local;
  
  internal::CheckNotNull<google::protobuf::SourceLocation>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
             ,0xafa,"\'out_location\' must not be NULL",out_location);
  if ((*(long *)(this + 0xb0) != 0) &&
     (this_00 = FileDescriptorTables::GetSourceLocation
                          (*(FileDescriptorTables **)(this + 0xa8),path,
                           *(SourceCodeInfo **)(this + 0xb0)),
     this_00 != (SourceCodeInfo_Location *)0x0)) {
    this_01 = SourceCodeInfo_Location::span(this_00);
    iVar1 = RepeatedField<int>::size(this_01);
    if ((iVar1 == 3) || (iVar1 = RepeatedField<int>::size(this_01), iVar1 == 4)) {
      piVar3 = RepeatedField<int>::Get(this_01,0);
      out_location->start_line = *piVar3;
      piVar3 = RepeatedField<int>::Get(this_01,1);
      out_location->start_column = *piVar3;
      iVar2 = RepeatedField<int>::size(this_01);
      iVar1 = 2;
      if (iVar2 == 3) {
        iVar1 = 0;
      }
      piVar3 = RepeatedField<int>::Get(this_01,iVar1);
      out_location->end_line = *piVar3;
      iVar1 = RepeatedField<int>::size(this_01);
      piVar3 = RepeatedField<int>::Get(this_01,iVar1 + -1);
      out_location->end_column = *piVar3;
      psVar4 = SourceCodeInfo_Location::leading_comments_abi_cxx11_(this_00);
      std::__cxx11::string::operator=((string *)&out_location->leading_comments,(string *)psVar4);
      psVar4 = SourceCodeInfo_Location::trailing_comments_abi_cxx11_(this_00);
      std::__cxx11::string::operator=((string *)&out_location->trailing_comments,(string *)psVar4);
      pRVar5 = SourceCodeInfo_Location::leading_detached_comments_abi_cxx11_(this_00);
      __first = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::begin(pRVar5);
      pRVar5 = SourceCodeInfo_Location::leading_detached_comments_abi_cxx11_(this_00);
      __last = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::end(pRVar5);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      assign<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &out_location->leading_detached_comments,
                 (RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )__first.it_,
                 (RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )__last.it_);
      return true;
    }
  }
  return false;
}

Assistant:

bool FileDescriptor::GetSourceLocation(const std::vector<int>& path,
                                       SourceLocation* out_location) const {
  GOOGLE_CHECK_NOTNULL(out_location);
  if (source_code_info_) {
    if (const SourceCodeInfo_Location* loc =
        tables_->GetSourceLocation(path, source_code_info_)) {
      const RepeatedField<int32>& span = loc->span();
      if (span.size() == 3 || span.size() == 4) {
        out_location->start_line   = span.Get(0);
        out_location->start_column = span.Get(1);
        out_location->end_line     = span.Get(span.size() == 3 ? 0 : 2);
        out_location->end_column   = span.Get(span.size() - 1);

        out_location->leading_comments = loc->leading_comments();
        out_location->trailing_comments = loc->trailing_comments();
        out_location->leading_detached_comments.assign(
            loc->leading_detached_comments().begin(),
            loc->leading_detached_comments().end());
        return true;
      }
    }
  }
  return false;
}